

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_FormatNumber
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  anon_class_24_3_faf3587d executor;
  bool bVar2;
  int iVar3;
  CallFlags e;
  BOOL BVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptBoolean *pJVar8;
  Recycler *pRVar9;
  UFieldPositionIterator *pUVar10;
  undefined4 uVar11;
  anon_class_16_2_4419d882 executor_00;
  int in_stack_fffffffffffffe90;
  UNumberFormatFields local_118;
  int kind;
  int i;
  int partEnd;
  int partStart;
  NumberFormatPartsBuilder nfpb;
  ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70> local_b8;
  ScopedUFieldPositionIterator fpi;
  UErrorCode status;
  undefined1 local_94 [4];
  undefined1 auStack_90 [4];
  int formattedLen;
  char16 *formatted;
  FinalizableUNumberFormat *fmt;
  Var cachedUNumberFormat;
  bool forNumberPrototypeToLocaleString;
  DynamicObject *pDStack_70;
  bool toParts;
  DynamicObject *state;
  double num;
  ScriptContext *scriptContext;
  CallInfo CStack_50;
  uint argCount;
  undefined1 local_48 [8];
  Arguments args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  iVar3 = _count_args(callInfo);
  values = _get_va(&stack0x00000000,iVar3);
  args.Values = (Type)callInfo;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),callInfo);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x958,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  CStack_50 = callInfo;
  Arguments::Arguments((Arguments *)local_48,callInfo,values);
  e = Js::operator&(callInfo._3_4_ &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x958,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  scriptContext._4_4_ = local_48._0_4_ & 0xffffff;
  num = (double)RecyclableObject::GetScriptContext(function);
  if (scriptContext._4_4_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x958,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((local_48._0_4_ & 0xffffff) == 5) {
    pvVar7 = Arguments::operator[]((Arguments *)local_48,1);
    bVar2 = TaggedInt::Is(pvVar7);
    if (!bVar2) {
      pvVar7 = Arguments::operator[]((Arguments *)local_48,1);
      bVar2 = JavascriptNumber::Is(pvVar7);
      if (!bVar2) goto LAB_0109a3b9;
    }
    pvVar7 = Arguments::operator[]((Arguments *)local_48,2);
    bVar2 = DynamicObject::IsBaseDynamicObject(pvVar7);
    if (bVar2) {
      pvVar7 = Arguments::operator[]((Arguments *)local_48,3);
      bVar2 = VarIs<Js::JavascriptBoolean>(pvVar7);
      if (bVar2) {
        pvVar7 = Arguments::operator[]((Arguments *)local_48,4);
        bVar2 = VarIs<Js::JavascriptBoolean>(pvVar7);
        if (bVar2) goto LAB_0109a424;
      }
    }
  }
LAB_0109a3b9:
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                              ,0x961,
                              "((args.Info.Count == 5 && (TaggedInt::Is(args[1]) || JavascriptNumber::Is(args[1])) && DynamicObject::IsBaseDynamicObject(args[2]) && VarIs<JavascriptBoolean>(args[3]) && VarIs<JavascriptBoolean>(args[4])))"
                              ,"Intl platform function given bad arguments");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 0;
LAB_0109a424:
  pvVar7 = Arguments::operator[]((Arguments *)local_48,1);
  state = (DynamicObject *)JavascriptConversion::ToNumber(pvVar7,(ScriptContext *)num);
  pvVar7 = Arguments::operator[]((Arguments *)local_48,2);
  pDStack_70 = UnsafeVarTo<Js::DynamicObject>(pvVar7);
  pvVar7 = Arguments::operator[]((Arguments *)local_48,3);
  pJVar8 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar7);
  BVar4 = JavascriptBoolean::GetValue(pJVar8);
  cachedUNumberFormat._7_1_ = BVar4 != 0;
  pvVar7 = Arguments::operator[]((Arguments *)local_48,4);
  pJVar8 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar7);
  BVar4 = JavascriptBoolean::GetValue(pJVar8);
  cachedUNumberFormat._6_1_ = BVar4 != 0;
  fmt = (FinalizableUNumberFormat *)0x0;
  iVar3 = (*(pDStack_70->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x14])
                    (pDStack_70,pDStack_70,10,&fmt,0);
  if (iVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x968,
                                "(state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, __null, scriptContext))"
                                ,
                                "state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, __null, scriptContext)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar11 = SUB84(state,0);
  if ((cachedUNumberFormat._6_1_ & 1) == 0) {
    if ((cachedUNumberFormat._7_1_ & 1) == 0) {
      Output::Trace(IntlPhase,L"%S(): Calling NumberFormat.prototype.format(%f)\n",uVar11,
                    "EntryIntl_FormatNumber");
    }
    else {
      Output::Trace(IntlPhase,L"%S(): Calling NumberFormat.prototype.formatToParts(%f)\n",uVar11,
                    "EntryIntl_FormatNumber");
    }
  }
  else {
    Output::Trace(IntlPhase,L"%S(): Calling %f.toLocaleString(...)\n",uVar11,
                  "EntryIntl_FormatNumber");
  }
  formatted = (char16 *)fmt;
  _auStack_90 = (char16 *)0x0;
  local_94 = (undefined1  [4])0x0;
  if ((cachedUNumberFormat._7_1_ & 1) == 0) {
    pRVar9 = ScriptContext::GetRecycler((ScriptContext *)num);
    executor_00.num = (double *)pRVar9;
    executor_00.fmt = (FinalizableUNumberFormat **)&state;
    EnsureBuffer<Js::IntlEngineInterfaceExtensionObject::EntryIntl_FormatNumber(Js::RecyclableObject*,Js::CallInfo,___)::__0>
              ((Js *)&formatted,executor_00,(Recycler *)auStack_90,(char16 **)local_94,(int *)0x0,
               true,in_stack_fffffffffffffe90);
    callInfo_local =
         (CallInfo)
         JavascriptString::NewWithBuffer(_auStack_90,(charcount_t)local_94,(ScriptContext *)num);
  }
  else {
    fpi.object._4_4_ = 0;
    pUVar10 = (UFieldPositionIterator *)ufieldpositer_open_70((undefined1 *)((long)&fpi.object + 4))
    ;
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70>
    ::ScopedICUObject(&local_b8,pUVar10);
    pRVar9 = ScriptContext::GetRecycler((ScriptContext *)num);
    executor.num._0_4_ = (int)&state;
    executor.fmt = (FinalizableUNumberFormat **)&formatted;
    executor.num._4_4_ = (int)((ulong)&state >> 0x20);
    executor.fpi = &local_b8;
    EnsureBuffer<Js::IntlEngineInterfaceExtensionObject::EntryIntl_FormatNumber(Js::RecyclableObject*,Js::CallInfo,___)::__1>
              (executor,pRVar9,(char16 **)auStack_90,(int *)local_94,false,8);
    NumberFormatPartsBuilder::NumberFormatPartsBuilder
              ((NumberFormatPartsBuilder *)&partEnd,(double)state,_auStack_90,(charcount_t)local_94,
               (ScriptContext *)num);
    i = 0;
    kind = 0;
    pUVar10 = PlatformAgnostic::ICUHelpers::ScopedICUObject::
              operator_cast_to_UFieldPositionIterator_((ScopedICUObject *)&local_b8);
    local_118 = ufieldpositer_next_70(pUVar10,&i,&kind);
    while (-1 < (int)local_118) {
      NumberFormatPartsBuilder::InsertPart((NumberFormatPartsBuilder *)&partEnd,local_118,i,kind);
      pUVar10 = PlatformAgnostic::ICUHelpers::ScopedICUObject::
                operator_cast_to_UFieldPositionIterator_((ScopedICUObject *)&local_b8);
      local_118 = ufieldpositer_next_70(pUVar10,&i,&kind);
    }
    callInfo_local =
         (CallInfo)NumberFormatPartsBuilder::ToPartsArray((NumberFormatPartsBuilder *)&partEnd);
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70>
    ::~ScopedICUObject(&local_b8);
  }
  return (Var)callInfo_local;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_FormatNumber(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#if defined(INTL_ICU)
        INTL_CHECK_ARGS(
            args.Info.Count == 5 &&
            (TaggedInt::Is(args[1]) || JavascriptNumber::Is(args[1])) &&
            DynamicObject::IsBaseDynamicObject(args[2]) &&
            VarIs<JavascriptBoolean>(args[3]) &&
            VarIs<JavascriptBoolean>(args[4])
        );

        double num = JavascriptConversion::ToNumber(args[1], scriptContext);
        DynamicObject *state = UnsafeVarTo<DynamicObject>(args[2]);
        bool toParts = UnsafeVarTo<JavascriptBoolean>(args[3])->GetValue();
        bool forNumberPrototypeToLocaleString = UnsafeVarTo<JavascriptBoolean>(args[4])->GetValue();
        Var cachedUNumberFormat = nullptr; // cached by EntryIntl_CacheNumberFormat
        AssertOrFailFast(state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, NULL, scriptContext));

        if (forNumberPrototypeToLocaleString)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Number_Prototype_toLocaleString);
            INTL_TRACE("Calling %f.toLocaleString(...)", num);
        }
        else if (toParts)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(NumberFormat_Prototype_formatToParts);
            INTL_TRACE("Calling NumberFormat.prototype.formatToParts(%f)", num);
        }
        else
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(NumberFormat_Prototype_format);
            INTL_TRACE("Calling NumberFormat.prototype.format(%f)", num);
        }

        auto fmt = static_cast<FinalizableUNumberFormat *>(cachedUNumberFormat);
        char16 *formatted = nullptr;
        int formattedLen = 0;

        if (!toParts)
        {
            EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
            {
                return unum_formatDouble(*fmt, num, buf, bufLen, nullptr, status);
            }, scriptContext->GetRecycler(), &formatted, &formattedLen);

            return JavascriptString::NewWithBuffer(formatted, formattedLen, scriptContext);
        }

#if defined(ICU_VERSION) && ICU_VERSION >= 61
        UErrorCode status = U_ZERO_ERROR;
        ScopedUFieldPositionIterator fpi(ufieldpositer_open(&status));

        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return unum_formatDoubleForFields(*fmt, num, buf, bufLen, fpi, status);
        }, scriptContext->GetRecycler(), &formatted, &formattedLen);

        NumberFormatPartsBuilder nfpb(num, formatted, formattedLen, scriptContext);

        int partStart = 0;
        int partEnd = 0;
        int i = 0;
        for (int kind = ufieldpositer_next(fpi, &partStart, &partEnd); kind >= 0; kind = ufieldpositer_next(fpi, &partStart, &partEnd), ++i)
        {
            nfpb.InsertPart(static_cast<UNumberFormatFields>(kind), partStart, partEnd);
        }

        return nfpb.ToPartsArray();
#else
        JavascriptLibrary *library = scriptContext->GetLibrary();
        JavascriptArray *ret = library->CreateArray(1);
        DynamicObject* part = library->CreateObject();
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return unum_formatDouble(*fmt, num, buf, bufLen, nullptr, status);
        }, scriptContext->GetRecycler(), &formatted, &formattedLen);
        JavascriptOperators::InitProperty(part, PropertyIds::type, library->GetIntlUnknownPartString());
        JavascriptOperators::InitProperty(part, PropertyIds::value, JavascriptString::NewWithBuffer(formatted, formattedLen, scriptContext));

        ret->SetItem(0, part, PropertyOperationFlags::PropertyOperation_None);
        return ret;
#endif // #if ICU_VERSION >= 61 ... #else
#else
        INTL_CHECK_ARGS(
            args.Info.Count == 3 &&
            (TaggedInt::Is(args.Values[1]) || JavascriptNumber::Is(args.Values[1])) &&
            DynamicObject::IsBaseDynamicObject(args.Values[2])
        );

        DynamicObject *options = VarTo<DynamicObject>(args.Values[2]);
        Var hiddenObject = nullptr;
        AssertOrFailFastMsg(options->GetInternalProperty(options, Js::InternalPropertyIds::HiddenObject, &hiddenObject, NULL, scriptContext),
            "EntryIntl_FormatNumber: Could not retrieve hiddenObject.");
        DelayLoadWindowsGlobalization* wsl = scriptContext->GetThreadContext()->GetWindowsGlobalizationLibrary();

        NumberFormatting::INumberFormatter *numberFormatter;
        numberFormatter = static_cast<NumberFormatting::INumberFormatter *>(((AutoCOMJSObject *)hiddenObject)->GetInstance());

        AutoHSTRING result;
        HRESULT hr;
        if (TaggedInt::Is(args.Values[1]))
        {
            IfFailThrowHr(numberFormatter->FormatInt(TaggedInt::ToInt32(args.Values[1]), &result));
        }
        else
        {
            IfFailThrowHr(numberFormatter->FormatDouble(JavascriptNumber::GetValue(args.Values[1]), &result));
        }

        PCWSTR strBuf = wsl->WindowsGetStringRawBuffer(*result, NULL);

        if (strBuf == nullptr)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
        else
        {
            JavascriptStringObject *retVal = scriptContext->GetLibrary()->CreateStringObject(Js::JavascriptString::NewCopySz(strBuf, scriptContext));
            return retVal;
        }
#endif
    }